

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  bool bVar1;
  uchar *p_00;
  XMLAttribute *this_00;
  char *pcVar2;
  XMLAttribute **ppXVar3;
  XMLError error;
  XMLDocument *pXVar4;
  int lineNum;
  XMLAttribute *pXVar5;
  
  p_00 = (uchar *)p;
  pXVar5 = (XMLAttribute *)0x0;
  while( true ) {
    if (p_00 == (uchar *)0x0) {
      return (char *)0x0;
    }
    p_00 = (uchar *)XMLUtil::SkipWhiteSpace((char *)p_00,curLineNumPtr);
    if (*p_00 == '\0') {
      pXVar4 = (this->super_XMLNode)._document;
      p_00 = (uchar *)XMLNode::Value(&this->super_XMLNode);
      lineNum = (this->super_XMLNode)._parseLineNum;
      error = XML_ERROR_PARSING_ELEMENT;
      goto LAB_00107214;
    }
    bVar1 = XMLUtil::IsNameStartChar(*p_00);
    if (!bVar1) {
      if (*p_00 == '/') {
        if (p_00[1] == '>') {
          this->_closingType = CLOSED;
          return (char *)(p_00 + 2);
        }
      }
      else if (*p_00 == '>') {
        return (char *)(p_00 + 1);
      }
      pXVar4 = (this->super_XMLNode)._document;
      lineNum = (this->super_XMLNode)._parseLineNum;
      error = XML_ERROR_PARSING_ELEMENT;
      goto LAB_00107214;
    }
    this_00 = CreateAttribute(this);
    pXVar4 = (this->super_XMLNode)._document;
    lineNum = pXVar4->_parseCurLineNum;
    this_00->_parseLineNum = lineNum;
    p_00 = (uchar *)XMLAttribute::ParseDeep
                              (this_00,(char *)p_00,pXVar4->_processEntities,curLineNumPtr);
    if (p_00 == (uchar *)0x0) break;
    pcVar2 = StrPair::GetStr(&this_00->_name);
    pcVar2 = Attribute(this,pcVar2,(char *)0x0);
    if (pcVar2 != (char *)0x0) break;
    ppXVar3 = &pXVar5->_next;
    if (pXVar5 == (XMLAttribute *)0x0) {
      ppXVar3 = &this->_rootAttribute;
    }
    *ppXVar3 = this_00;
    pXVar5 = this_00;
  }
  DeleteAttribute(this_00);
  pXVar4 = (this->super_XMLNode)._document;
  error = XML_ERROR_PARSING_ATTRIBUTE;
LAB_00107214:
  XMLDocument::SetError(pXVar4,error,p,(char *)p_00,lineNum);
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name(), _parseLineNum );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p, attrLineNum );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p, _parseLineNum );
            return 0;
        }
    }
    return p;
}